

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::HugeIntegerCastOperation::
     Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
               (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *state)

{
  ResultType *this;
  uhugeint_t left;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uhugeint_t uStack_48;
  uhugeint_t local_38;
  
  bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::Flush(state);
  if ((bVar1) &&
     (bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::FlushDecimal
                        (state), bVar1)) {
    this = &state->decimal;
    uhugeint_t::uhugeint_t(&uStack_48,0);
    bVar1 = uhugeint_t::operator==(this,&uStack_48);
    if (bVar1) {
      bVar1 = true;
    }
    else {
      uVar3 = (uint)state->decimal_total_digits;
      bVar1 = true;
      if (state->decimal_total_digits != 0) {
        while (0x27 < (ushort)uVar3) {
          uhugeint_t::operator/=(this,(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + 0x270));
          uVar3 = *(int *)&state->decimal_total_digits - 0x27;
          state->decimal_total_digits = (uint16_t)uVar3;
        }
        uhugeint_t::operator/=
                  (this,(uhugeint_t *)
                        (Date::DAY_NAMES_ABBREVIATED + (ulong)((uVar3 & 0xffff) << 4) + 0x60));
        uhugeint_t::uhugeint_t(&uStack_48,5);
        bVar2 = uhugeint_t::operator>=(this,&uStack_48);
        if (bVar2) {
          left.lower = (state->result).lower;
          left.upper = (state->result).upper;
          uhugeint_t::uhugeint_t(&local_38,1);
          bVar1 = TrySubtractOperator::
                  Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                            (left,local_38,&state->result);
        }
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		if (!state.Flush() || !state.FlushDecimal()) {
			return false;
		}

		if (state.decimal == 0 || state.decimal_total_digits == 0) {
			return true;
		}

		// Get the first (left-most) digit of the decimals
		while (state.decimal_total_digits > 39) {
			state.decimal /= T::Operation::POWERS_OF_TEN[39];
			state.decimal_total_digits -= 39;
		}
		D_ASSERT((state.decimal_total_digits - 1) >= 0 && (state.decimal_total_digits - 1) <= 39);
		state.decimal /= T::Operation::POWERS_OF_TEN[state.decimal_total_digits - 1];

		if (state.decimal >= 5) {
			if (NEGATIVE) {
				return TrySubtractOperator::Operation(state.result, result_t(1), state.result);
			} else {
				return TryAddOperator::Operation(state.result, result_t(1), state.result);
			}
		}
		return true;
	}